

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall
Refal2::COperationsExecuter::matchRightWithQulifierBegin_V
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  bool bVar1;
  
  bVar1 = shiftRight(this);
  if ((bVar1) && (bVar1 = checkQualifier(this,this->right,qualifier), bVar1)) {
    if (((this->right->super_CUnit).type & UT_RightParen) != 0) {
      this->right = (CUnitNode *)(this->right->super_CUnit).field_1;
    }
    this->operation = this->operation->next;
    saveState(this);
    return true;
  }
  return false;
}

Assistant:

inline bool COperationsExecuter::matchRightWithQulifierBegin_V(
	const TQualifierIndex qualifier )
{
	if( shiftRight() && checkQualifier( right, qualifier ) ) {
		if( right->IsRightParen() ) {
			right = right->PairedParen();
		}
		nextOperation();
		saveState();
		return true;
	} else {
		return false;
	}
}